

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLCellABecLap::define
          (MLCellABecLap *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory)

{
  long lVar1;
  long lVar2;
  
  MLCellLinOp::define(&this->super_MLCellLinOp,a_geom,a_grids,a_dmap,a_info,a_factory);
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(&(this->m_overset_mask).
            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
           ,(long)(this->super_MLCellLinOp).super_MLLinOp.m_num_amr_levels);
  if (0 < (this->super_MLCellLinOp).super_MLLinOp.m_num_amr_levels) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::resize((vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)((long)&(((this->m_overset_mask).
                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          ).
                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  + lVar1),
               (long)(this->super_MLCellLinOp).super_MLLinOp.m_num_mg_levels.
                     super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar2]);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < (this->super_MLCellLinOp).super_MLLinOp.m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLCellABecLap::define (const Vector<Geometry>& a_geom,
                       const Vector<BoxArray>& a_grids,
                       const Vector<DistributionMapping>& a_dmap,
                       const LPInfo& a_info,
                       const Vector<FabFactory<FArrayBox> const*>& a_factory)
{
    MLCellLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory);

    m_overset_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_overset_mask[amrlev].resize(m_num_mg_levels[amrlev]);
    }
}